

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-common.cpp
# Opt level: O2

void __thiscall Dashel::IPV4Address::IPV4Address(IPV4Address *this,string *name,unsigned_short port)

{
  int iVar1;
  undefined8 in_RAX;
  hostent *phVar2;
  uint uVar3;
  in_addr addr;
  in_addr local_14;
  
  local_14.s_addr = (in_addr_t)((ulong)in_RAX >> 0x20);
  this->port = port;
  phVar2 = gethostbyname((name->_M_dataplus)._M_p);
  if (phVar2 == (hostent *)0x0) {
    iVar1 = inet_aton((name->_M_dataplus)._M_p,&local_14);
    uVar3 = local_14.s_addr >> 0x18 | (local_14.s_addr & 0xff0000) >> 8 |
            (local_14.s_addr & 0xff00) << 8 | local_14.s_addr << 0x18;
    if (iVar1 == 0) {
      uVar3 = 0;
    }
  }
  else {
    uVar3 = *(uint *)*phVar2->h_addr_list;
    uVar3 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  }
  this->address = uVar3;
  return;
}

Assistant:

IPV4Address::IPV4Address(const std::string& name, unsigned short port) :
		port(port)
	{
		hostent* he = gethostbyname(name.c_str());

		if (he == NULL)
		{
#ifndef WIN32
			struct in_addr addr;
			if (inet_aton(name.c_str(), &addr))
			{
				address = ntohl(addr.s_addr);
			}
			else
			{
				address = INADDR_ANY;
			}
#else // WIN32
			unsigned long addr = inet_addr(name.c_str());
			if (addr != INADDR_NONE)
				address = addr;
			else
				address = INADDR_ANY;
#endif // WIN32
		}
		else
		{
#ifndef WIN32
			address = ntohl(*((unsigned*)he->h_addr));
#else
			address = ntohl(*((unsigned*)he->h_addr));
#endif
		}
	}